

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(char lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  char ret;
  undefined8 uStack_18;
  
  uStack_18._6_2_ = (undefined2)((uint7)in_register_00000001 >> 0x28);
  uStack_18._0_5_ = (undefined5)CONCAT71(in_register_00000001,in_AL);
  uStack_18._0_6_ = CONCAT15(lhs,(undefined5)uStack_18);
  uStack_18 = CONCAT35(uStack_18._5_3_,(undefined5)uStack_18) & 0xffffff00ffffffff;
  bVar1 = DivisionCornerCaseHelper2<char,_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase2
                    (lhs,rhs,(SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                             ((long)&uStack_18 + 4));
  if (bVar1) {
  }
  else {
    uStack_18 = (ulong)CONCAT16(rhs.m_int,(int6)uStack_18);
    DivisionHelper<char,_char,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((char *)((long)&uStack_18 + 5),(char *)((long)&uStack_18 + 6),
               (char *)((long)&uStack_18 + 7));
    uStack_18._4_1_ = uStack_18._7_1_;
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)uStack_18._4_1_;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}